

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O1

void __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::computeBoundingBox
          (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
           *this,BoundingBox *bbox)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  vector<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
  *pvVar4;
  pointer pPVar5;
  Vector *pVVar6;
  runtime_error *this_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  pvVar4 = this->dataset->m_points;
  pPVar5 = (pvVar4->
           super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(pvVar4->
                super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5;
  if (lVar8 != 0) {
    uVar7 = (lVar8 >> 3) * -0x3333333333333333;
    lVar8 = 0;
    do {
      uVar2 = *(undefined8 *)
               ((long)&(pPVar5->point).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage + lVar8);
      *(undefined8 *)((long)&bbox->_M_elems[0].high + lVar8 * 2) = uVar2;
      *(undefined8 *)((long)&bbox->_M_elems[0].low + lVar8 * 2) = uVar2;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x18);
    if (1 < uVar7) {
      pVVar6 = &pPVar5[1].point;
      uVar9 = 1;
      do {
        lVar8 = 0;
        do {
          dVar3 = *(double *)
                   ((long)&(pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                           m_storage.m_data + lVar8);
          if (dVar3 < *(double *)((long)&bbox->_M_elems[0].low + lVar8 * 2)) {
            *(double *)((long)&bbox->_M_elems[0].low + lVar8 * 2) = dVar3;
          }
          dVar3 = *(double *)
                   ((long)&(pVVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                           m_storage.m_data + lVar8);
          pdVar1 = (double *)((long)&bbox->_M_elems[0].high + lVar8 * 2);
          if (*pdVar1 <= dVar3 && dVar3 != *pdVar1) {
            *(double *)((long)&bbox->_M_elems[0].high + lVar8 * 2) = dVar3;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x18);
        uVar9 = uVar9 + 1;
        pVVar6 = (Vector *)((long)(pVVar6 + 1) + 0x10);
      } while (uVar9 != uVar7);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"[nanoflann] computeBoundingBox() called but no data points found.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void computeBoundingBox(BoundingBox &bbox) {
    resize(bbox, (DIM > 0 ? DIM : BaseClassRef::dim));
    if (dataset.kdtree_get_bbox(bbox)) {
      // Done! It was implemented in derived class
    } else {
      const size_t N = dataset.kdtree_get_point_count();
      if (!N)
        throw std::runtime_error("[nanoflann] computeBoundingBox() called but "
                                 "no data points found.");
      for (int i = 0; i < (DIM > 0 ? DIM : BaseClassRef::dim); ++i) {
        bbox[i].low = bbox[i].high = this->dataset_get(*this, 0, i);
      }
      for (size_t k = 1; k < N; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : BaseClassRef::dim); ++i) {
          if (this->dataset_get(*this, k, i) < bbox[i].low)
            bbox[i].low = this->dataset_get(*this, k, i);
          if (this->dataset_get(*this, k, i) > bbox[i].high)
            bbox[i].high = this->dataset_get(*this, k, i);
        }
      }
    }
  }